

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::log_internal::anon_unknown_0::GlobalLogSinkSet::LogToSinks
          (GlobalLogSinkSet *this,LogEntry *entry,Span<absl::lts_20250127::LogSink_*> extra_sinks,
          bool extra_sinks_only)

{
  bool bVar1;
  LogSeverity severity;
  bool *pbVar2;
  string_view message;
  Span<absl::lts_20250127::LogSink_*> SVar3;
  Span<absl::lts_20250127::LogSink_*> sinks;
  LogEntry *local_80;
  pointer local_78;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_build_O0__deps_absl_src_absl_log_internal_log_sink_set_cc:200:31)>
  local_5a;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_build_O0__deps_absl_src_absl_log_internal_log_sink_set_cc:200:31)>
  status_cleanup;
  ReaderMutexLock global_sinks_lock;
  bool extra_sinks_only_local;
  LogEntry *entry_local;
  GlobalLogSinkSet *this_local;
  Span<absl::lts_20250127::LogSink_*> extra_sinks_local;
  
  sinks.len_ = (pointer)extra_sinks.len_;
  sinks.ptr_ = sinks.len_;
  SendToSinks((GlobalLogSinkSet *)entry,(LogEntry *)extra_sinks.ptr_,sinks);
  if (!extra_sinks_only) {
    bVar1 = ThreadIsLoggingToLogSink();
    if (bVar1) {
      message = LogEntry::text_message_with_prefix_and_newline(entry);
      severity = LogEntry::log_severity(entry);
      WriteToStderr(message,severity);
    }
    else {
      ReaderMutexLock::ReaderMutexLock((ReaderMutexLock *)&stack0xffffffffffffffa8,&this->guard_);
      pbVar2 = ThreadIsLoggingStatus();
      *pbVar2 = true;
      MakeCleanup<,absl::lts_20250127::log_internal::(anonymous_namespace)::GlobalLogSinkSet::LogToSinks(absl::lts_20250127::LogEntry_const&,absl::lts_20250127::Span<absl::lts_20250127::LogSink*>,bool)::_lambda()_1_>
                (&local_5a);
      SVar3 = MakeSpan<std::vector<absl::lts_20250127::LogSink_*,_std::allocator<absl::lts_20250127::LogSink_*>_>_>
                        (&this->sinks_);
      local_80 = (LogEntry *)SVar3.ptr_;
      local_78 = (pointer)SVar3.len_;
      SVar3.len_ = (size_type)sinks.len_;
      SVar3.ptr_ = local_78;
      SendToSinks((GlobalLogSinkSet *)entry,local_80,SVar3);
      Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/log/internal/log_sink_set.cc:200:31)>
      ::~Cleanup(&local_5a);
      ReaderMutexLock::~ReaderMutexLock((ReaderMutexLock *)&stack0xffffffffffffffa8);
    }
  }
  return;
}

Assistant:

ABSL_LOCKS_EXCLUDED(guard_) {
    SendToSinks(entry, extra_sinks);

    if (!extra_sinks_only) {
      if (ThreadIsLoggingToLogSink()) {
        absl::log_internal::WriteToStderr(
            entry.text_message_with_prefix_and_newline(), entry.log_severity());
      } else {
        absl::ReaderMutexLock global_sinks_lock(&guard_);
        ThreadIsLoggingStatus() = true;
        // Ensure the "thread is logging" status is reverted upon leaving the
        // scope even in case of exceptions.
        auto status_cleanup =
            absl::MakeCleanup([] { ThreadIsLoggingStatus() = false; });
        SendToSinks(entry, absl::MakeSpan(sinks_));
      }
    }
  }